

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

int Vec_IntTwoFindCommon(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long extraout_RAX;
  int *piVar6;
  int *piVar7;
  
  piVar6 = vArr1->pArray;
  piVar7 = vArr2->pArray;
  iVar4 = vArr1->nSize;
  iVar3 = vArr2->nSize;
  vArr->nSize = 0;
  if (0 < iVar3 && 0 < (long)iVar4) {
    piVar1 = piVar6 + iVar4;
    lVar5 = (long)iVar3;
    piVar2 = piVar7 + lVar5;
    do {
      iVar4 = *piVar6;
      if (iVar4 == *piVar7) {
        Vec_IntPush(vArr,iVar4);
        piVar6 = piVar6 + 1;
        lVar5 = extraout_RAX;
LAB_007904c6:
        piVar7 = piVar7 + 1;
      }
      else {
        if (*piVar7 <= iVar4) goto LAB_007904c6;
        piVar6 = piVar6 + 1;
      }
      iVar4 = (int)lVar5;
    } while ((piVar6 < piVar1) && (piVar7 < piVar2));
  }
  return iVar4;
}

Assistant:

static inline int Vec_IntTwoFindCommon( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    Vec_IntClear( vArr );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            Vec_IntPush( vArr, *pBeg1 ), pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            pBeg1++;
        else 
            pBeg2++;
    }
    return Vec_IntSize(vArr);
}